

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O1

void opj_pi_update_encode_poc_and_final
               (opj_cp_t *p_cp,OPJ_UINT32 p_tileno,OPJ_INT32 p_tx0,OPJ_INT32 p_tx1,OPJ_INT32 p_ty0,
               OPJ_INT32 p_ty1,OPJ_UINT32 p_max_prec,OPJ_UINT32 p_max_res,OPJ_UINT32 p_dx_min,
               OPJ_UINT32 p_dy_min)

{
  opj_tcp_t *poVar1;
  OPJ_UINT32 OVar2;
  uint uVar3;
  OPJ_UINT32 OVar4;
  OPJ_UINT32 *pOVar5;
  
  if (p_tileno < p_cp->th * p_cp->tw) {
    poVar1 = p_cp->tcps;
    OVar4 = poVar1[p_tileno].numpocs;
    poVar1[p_tileno].pocs[0].compE = poVar1[p_tileno].pocs[0].compno1;
    OVar2 = poVar1[p_tileno].pocs[0].compno0;
    poVar1[p_tileno].pocs[0].resS = poVar1[p_tileno].pocs[0].resno0;
    poVar1[p_tileno].pocs[0].compS = OVar2;
    OVar2 = poVar1[p_tileno].pocs[0].resno1;
    poVar1[p_tileno].pocs[0].layE = poVar1[p_tileno].pocs[0].layno1;
    poVar1[p_tileno].pocs[0].resE = OVar2;
    poVar1[p_tileno].pocs[0].layS = 0;
    poVar1[p_tileno].pocs[0].prg = poVar1[p_tileno].pocs[0].prg1;
    poVar1[p_tileno].pocs[0].prcS = 0;
    poVar1[p_tileno].pocs[0].prcE = p_max_prec;
    poVar1[p_tileno].pocs[0].txS = p_tx0;
    poVar1[p_tileno].pocs[0].txE = p_tx1;
    poVar1[p_tileno].pocs[0].tyS = p_ty0;
    poVar1[p_tileno].pocs[0].tyE = p_ty1;
    poVar1[p_tileno].pocs[0].dx = p_max_res;
    poVar1[p_tileno].pocs[0].dy = p_dx_min;
    if (OVar4 - 1 < 0xfffffffe) {
      pOVar5 = &poVar1[p_tileno].pocs[1].dy;
      do {
        *(undefined8 *)(pOVar5 + -0xc) = *(undefined8 *)(pOVar5 + -0x1e);
        *(undefined8 *)(pOVar5 + -8) = *(undefined8 *)(pOVar5 + -0x1b);
        uVar3 = pOVar5[-0x1c];
        pOVar5[-9] = uVar3;
        pOVar5[-0x15] = pOVar5[-0x16];
        pOVar5[-10] = 0;
        if (uVar3 <= pOVar5[-0x2e]) {
          uVar3 = 0;
        }
        pOVar5[-0xd] = uVar3;
        pOVar5[-6] = p_max_prec;
        pOVar5[-5] = p_tx0;
        pOVar5[-4] = p_tx1;
        pOVar5[-3] = p_ty0;
        pOVar5[-2] = p_ty1;
        pOVar5[-1] = p_max_res;
        *pOVar5 = p_dx_min;
        pOVar5 = pOVar5 + 0x25;
        OVar4 = OVar4 - 1;
      } while (OVar4 != 0);
    }
    return;
  }
  __assert_fail("p_tileno < p_cp->tw * p_cp->th",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/pi.c"
                ,0x42f,
                "void opj_pi_update_encode_poc_and_final(opj_cp_t *, OPJ_UINT32, OPJ_INT32, OPJ_INT32, OPJ_INT32, OPJ_INT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32)"
               );
}

Assistant:

static void opj_pi_update_encode_poc_and_final(opj_cp_t *p_cp,
        OPJ_UINT32 p_tileno,
        OPJ_INT32 p_tx0,
        OPJ_INT32 p_tx1,
        OPJ_INT32 p_ty0,
        OPJ_INT32 p_ty1,
        OPJ_UINT32 p_max_prec,
        OPJ_UINT32 p_max_res,
        OPJ_UINT32 p_dx_min,
        OPJ_UINT32 p_dy_min)
{
    /* loop*/
    OPJ_UINT32 pino;
    /* tile coding parameter*/
    opj_tcp_t *l_tcp = 00;
    /* current poc being updated*/
    opj_poc_t * l_current_poc = 00;

    /* number of pocs*/
    OPJ_UINT32 l_poc_bound;

    OPJ_ARG_NOT_USED(p_max_res);

    /* preconditions in debug*/
    assert(p_cp != 00);
    assert(p_tileno < p_cp->tw * p_cp->th);

    /* initializations*/
    l_tcp = &p_cp->tcps [p_tileno];
    /* number of iterations in the loop */
    l_poc_bound = l_tcp->numpocs + 1;

    /* start at first element, and to make sure the compiler will not make a calculation each time in the loop
       store a pointer to the current element to modify rather than l_tcp->pocs[i]*/
    l_current_poc = l_tcp->pocs;

    l_current_poc->compS = l_current_poc->compno0;
    l_current_poc->compE = l_current_poc->compno1;
    l_current_poc->resS = l_current_poc->resno0;
    l_current_poc->resE = l_current_poc->resno1;
    l_current_poc->layE = l_current_poc->layno1;

    /* special treatment for the first element*/
    l_current_poc->layS = 0;
    l_current_poc->prg  = l_current_poc->prg1;
    l_current_poc->prcS = 0;

    l_current_poc->prcE = p_max_prec;
    l_current_poc->txS = (OPJ_UINT32)p_tx0;
    l_current_poc->txE = (OPJ_UINT32)p_tx1;
    l_current_poc->tyS = (OPJ_UINT32)p_ty0;
    l_current_poc->tyE = (OPJ_UINT32)p_ty1;
    l_current_poc->dx = p_dx_min;
    l_current_poc->dy = p_dy_min;

    ++ l_current_poc;
    for (pino = 1; pino < l_poc_bound ; ++pino) {
        l_current_poc->compS = l_current_poc->compno0;
        l_current_poc->compE = l_current_poc->compno1;
        l_current_poc->resS = l_current_poc->resno0;
        l_current_poc->resE = l_current_poc->resno1;
        l_current_poc->layE = l_current_poc->layno1;
        l_current_poc->prg  = l_current_poc->prg1;
        l_current_poc->prcS = 0;
        /* special treatment here different from the first element*/
        l_current_poc->layS = (l_current_poc->layE > (l_current_poc - 1)->layE) ?
                              l_current_poc->layE : 0;

        l_current_poc->prcE = p_max_prec;
        l_current_poc->txS = (OPJ_UINT32)p_tx0;
        l_current_poc->txE = (OPJ_UINT32)p_tx1;
        l_current_poc->tyS = (OPJ_UINT32)p_ty0;
        l_current_poc->tyE = (OPJ_UINT32)p_ty1;
        l_current_poc->dx = p_dx_min;
        l_current_poc->dy = p_dy_min;
        ++ l_current_poc;
    }
}